

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::TPZManVector
          (TPZManVector<TPZEqnArray<long_double>,_10> *this,
          TPZManVector<TPZEqnArray<long_double>,_10> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  TPZEqnArray<long_double> *pTVar5;
  TPZVec<TPZEqnArray<long_double>_> *in_RSI;
  TPZVec<TPZEqnArray<long_double>_> *in_RDI;
  ulong uVar6;
  int64_t i;
  int64_t size;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff38;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff40;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff70;
  TPZEqnArray<long_double> *this_00;
  TPZVec<TPZEqnArray<long_double>_> *local_38;
  long local_30;
  
  TPZVec<TPZEqnArray<long_double>_>::TPZVec(in_RDI);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_025509e8;
  local_38 = in_RDI + 1;
  do {
    TPZEqnArray<long_double>::TPZEqnArray(in_stack_ffffffffffffff70);
    local_38 = local_38 + 0x28f;
  } while (local_38 != in_RDI + 0x1997);
  uVar2 = TPZVec<TPZEqnArray<long_double>_>::NElements(in_RSI);
  if ((long)uVar2 < 0xb) {
    in_RDI->fStore = (TPZEqnArray<long_double> *)(in_RDI + 1);
    in_RDI->fNElements = uVar2;
    in_RDI->fNAlloc = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x51e0),0);
    uVar6 = uVar3 + 0x10;
    if (0xffffffffffffffef < uVar3) {
      uVar6 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x51e0),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar6);
    *(ulong *)((long)pvVar4 + 8) = uVar2;
    pTVar5 = (TPZEqnArray<long_double> *)((long)pvVar4 + 0x10);
    if (uVar2 != 0) {
      this_00 = pTVar5;
      do {
        TPZEqnArray<long_double>::TPZEqnArray(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pTVar5 + uVar2);
    }
    in_RDI->fStore = pTVar5;
    in_RDI->fNElements = uVar2;
    in_RDI->fNAlloc = uVar2;
  }
  for (local_30 = 0; local_30 < (long)uVar2; local_30 = local_30 + 1) {
    TPZEqnArray<long_double>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}